

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O2

void Dau_DsdRemoveBraces(char *pDsd,int *pMatches)

{
  char cVar1;
  char *pcVar2;
  char *local_10;
  
  if (pDsd[1] == '\0') {
    return;
  }
  local_10 = pDsd;
  Dau_DsdRemoveBraces_rec(pDsd,&local_10,pMatches);
  pcVar2 = pDsd;
  do {
    cVar1 = *pDsd;
    if (cVar1 != ' ') {
      if (cVar1 == '!') {
        if (pDsd != pcVar2 && pcVar2[-1] == '!') {
          pcVar2 = pcVar2 + -1;
          goto LAB_0043a4ab;
        }
      }
      else if (cVar1 == '\0') {
        *pcVar2 = '\0';
        return;
      }
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + 1;
    }
LAB_0043a4ab:
    pDsd = pDsd + 1;
  } while( true );
}

Assistant:

void Dau_DsdRemoveBraces( char * pDsd, int * pMatches )
{
    char * q, * p = pDsd;
    if ( pDsd[1] == 0 )
        return;
    Dau_DsdRemoveBraces_rec( pDsd, &pDsd, pMatches );
    for ( q = p; *p; p++ )
        if ( *p != ' ' )
        {
            if ( *p == '!' && *(q-1) == '!' && p != q )
            {
                q--;
                continue;
            }
            *q++ = *p;
        }
    *q = 0;
}